

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O1

int mtar_read_header(mtar_t *tar,mtar_header_t *h)

{
  size_t sVar1;
  uint i;
  int iVar2;
  size_t sVar3;
  long lVar4;
  uint res;
  int iVar5;
  uint chksum2;
  longlong size;
  mtar_raw_header_t rh;
  int local_234;
  size_t local_230;
  byte local_228 [148];
  char local_194 [8];
  byte local_18c [356];
  
  tar->last_header = tar->pos;
  iVar2 = (*tar->read)(tar,local_228,0x200);
  tar->pos = tar->pos + 0x200;
  if (iVar2 == 0) {
    sVar1 = tar->last_header;
    iVar2 = (*tar->seek)(tar,sVar1);
    tar->pos = sVar1;
    if (iVar2 == 0) {
      sVar3 = strlen((char *)local_228);
      iVar2 = -9;
      if (sVar3 < 100) {
        sVar3 = strlen((char *)(local_18c + 1));
        if (sVar3 < 100) {
          if (local_194[0] == '\0') {
            iVar2 = -7;
          }
          else {
            iVar5 = 0x100;
            lVar4 = 0;
            do {
              iVar5 = iVar5 + (uint)local_228[lVar4];
              lVar4 = lVar4 + 1;
            } while (lVar4 != 0x94);
            lVar4 = 0x9c;
            do {
              iVar5 = iVar5 + (uint)local_228[lVar4];
              lVar4 = lVar4 + 1;
            } while (lVar4 != 0x200);
            __isoc99_sscanf(local_194,"%7o",&local_234);
            iVar2 = -6;
            if (iVar5 == local_234) {
              __isoc99_sscanf(local_228 + 100,"%7o",h);
              __isoc99_sscanf(local_228 + 0x6c,"%7o",&h->owner);
              local_230 = 0;
              __isoc99_sscanf(local_228 + 0x7c,"%11llo",&local_230);
              h->size = local_230;
              __isoc99_sscanf(local_228 + 0x88,"%11o",&h->mtime);
              h->type = (int)(char)local_18c[0];
              iVar2 = -10;
              if (h->size >> 0x21 == 0) {
                strcpy(h->name,(char *)local_228);
                strcpy(h->linkname,(char *)(local_18c + 1));
                iVar2 = 0;
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int mtar_read_header(mtar_t *tar, mtar_header_t *h) {
  int err;
  mtar_raw_header_t rh;
  /* Save header position */
  tar->last_header = tar->pos;
  /* Read raw header */
  err = mtar_tread(tar, &rh, sizeof(rh));
  if (err) {
    return err;
  }
  /* Seek back to start of header */
  err = mtar_seek(tar, tar->last_header);
  if (err) {
    return err;
  }
  /* Load raw header into header struct and return */
  return mtar_raw_to_header(h, &rh);
}